

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O1

ecs_entity_t * ecs_bulk_new_w_entity(ecs_world_t *world,ecs_entity_t entity,int32_t count)

{
  _Bool _Var1;
  ecs_stage_t *stage;
  ecs_table_t *table;
  ecs_entity_t **ids_out;
  ecs_entity_t *ids;
  ecs_entities_t components;
  ecs_world_t *local_48;
  ecs_entity_t *local_40;
  ecs_entities_t local_38;
  ecs_entity_t local_28;
  
  local_48 = world;
  local_28 = entity;
  stage = ecs_get_stage(&local_48);
  local_38.count = 1;
  ids_out = &local_40;
  local_38.array = &local_28;
  _Var1 = ecs_defer_bulk_new(local_48,stage,count,&local_38,(void **)0x0,ids_out);
  if (!_Var1) {
    table = ecs_table_find_or_create(local_48,&local_38);
    local_40 = new_w_data(local_48,table,(ecs_entities_t *)(ulong)(uint)count,0,(void **)0x0,
                          (int32_t *)ids_out);
    ecs_defer_flush(local_48,stage);
  }
  return local_40;
}

Assistant:

const ecs_entity_t* ecs_bulk_new_w_entity(
    ecs_world_t *world,
    ecs_entity_t entity,
    int32_t count)
{
    ecs_stage_t *stage = ecs_get_stage(&world);
    ecs_entities_t components = {
        .array = &entity,
        .count = 1
    };
    const ecs_entity_t *ids;
    if (ecs_defer_bulk_new(world, stage, count, &components, NULL, &ids)) {
        return ids;
    }
    ecs_table_t *table = ecs_table_find_or_create(world, &components);
    ids = new_w_data(world, table, NULL, count, NULL, NULL);
    ecs_defer_flush(world, stage);
    return ids;
}